

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS
ref_search_gather(REF_SEARCH ref_search,REF_LIST ref_list,REF_INT parent,REF_DBL *position,
                 REF_DBL radius)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  
  if (parent == -1 || ref_search->n == 0) {
    return 0;
  }
  if (parent < 0 || ref_search->n <= parent) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0xc6,
           "ref_search_gather","parent invalid");
    printf("%d n %d parent\n",(ulong)(uint)ref_search->n,(ulong)(uint)parent);
    return 1;
  }
  if (ref_search->item[(uint)parent] == -1) {
    return 0;
  }
  iVar1 = ref_search->d;
  dVar6 = 0.0;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      dVar7 = position[lVar3] - ref_search->pos[(ulong)(uint)(parent * iVar1) + lVar3];
      dVar6 = dVar6 + dVar7 * dVar7;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if ((ref_search->radius[(uint)parent] + radius < dVar6) ||
     (uVar2 = ref_list_push(ref_list,ref_search->item[(uint)parent]), uVar2 == 0)) {
    if (ref_search->children_ball[(uint)parent] < dVar6 - radius) {
      return 0;
    }
    uVar2 = ref_search_gather(ref_search,ref_list,ref_search->left[(uint)parent],position,radius);
    if (uVar2 == 0) {
      uVar2 = ref_search_gather(ref_search,ref_list,ref_search->right[(uint)parent],position,radius)
      ;
      if (uVar2 == 0) {
        return 0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0xdd
             ,"ref_search_gather",(ulong)uVar2,"gthr");
      return uVar2;
    }
    pcVar5 = "gthr";
    uVar4 = 0xda;
  }
  else {
    pcVar5 = "add item";
    uVar4 = 0xd2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar4,
         "ref_search_gather",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_search_gather(REF_SEARCH ref_search,
                                            REF_LIST ref_list, REF_INT parent,
                                            REF_DBL *position, REF_DBL radius) {
  REF_INT i;
  REF_DBL distance;

  if (0 == ref_search->n) return REF_SUCCESS;  /* tree empty */
  if (REF_EMPTY == parent) return REF_SUCCESS; /* finished traversing */
  RAB(0 <= parent && parent < ref_search->n, "parent invalid",
      { printf("%d n %d parent\n", ref_search->n, parent); })
  /* finished traversing */
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  distance = 0.0;
  for (i = 0; i < ref_search->d; i++)
    distance +=
        pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  distance = sqrt(distance);

  /* if the distance between me and the target are less than combined radii */
  if (distance <= ref_search->radius[parent] + radius) {
    RSS(ref_list_push(ref_list, ref_search->item[parent]), "add item");
  }

  /* if the distance between me and the target are less than children
   * children_ball includes child radii, so only subtract target radius */
  if (distance - radius <= ref_search->children_ball[parent]) {
    RSS(ref_search_gather(ref_search, ref_list, ref_search->left[parent],
                          position, radius),
        "gthr");
    RSS(ref_search_gather(ref_search, ref_list, ref_search->right[parent],
                          position, radius),
        "gthr");
  }

  return REF_SUCCESS;
}